

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_note.cpp
# Opt level: O1

void __thiscall BmsNoteManager::DP_TO_SP(BmsNoteManager *this)

{
  _Base_ptr p_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  mapped_type *pmVar4;
  _Rb_tree_node_base *p_Var5;
  undefined1 *puVar6;
  int c;
  long lVar7;
  map<int,_BmsNote,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_> *this_00;
  _Rb_tree_color local_3c;
  BmsNoteManager *local_38;
  
  lVar7 = 10;
  local_38 = this;
  do {
    puVar6 = &this->lanes_[lVar7].field_0x8;
    p_Var5 = *(_Rb_tree_node_base **)&this->lanes_[lVar7].field_0x18;
    if (p_Var5 != (_Rb_tree_node_base *)puVar6) {
      this_00 = (map<int,_BmsNote,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
                 *)((long)local_38 + lVar7 * 0x30 + -0x1e0);
      do {
        local_3c = p_Var5[1]._M_color;
        if (*(int *)&p_Var5[1]._M_parent != 0) {
          pmVar4 = std::
                   map<int,_BmsNote,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
                   ::operator[](this_00,(key_type *)&local_3c);
          p_Var1 = p_Var5[1]._M_left;
          uVar2 = *(undefined8 *)((long)&p_Var5[1]._M_left + 4);
          uVar3 = *(undefined8 *)((long)&p_Var5[1]._M_right + 4);
          *(_Base_ptr *)pmVar4 = p_Var5[1]._M_parent;
          *(_Base_ptr *)&pmVar4->time = p_Var1;
          *(undefined8 *)&pmVar4->field_0xc = uVar2;
          *(undefined8 *)((long)&pmVar4->pos + 4) = uVar3;
        }
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      } while (p_Var5 != (_Rb_tree_node_base *)puVar6);
    }
    this = local_38;
    std::
    _Rb_tree<int,_std::pair<const_int,_BmsNote>,_std::_Select1st<std::pair<const_int,_BmsNote>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
    ::clear((_Rb_tree<int,_std::pair<const_int,_BmsNote>,_std::_Select1st<std::pair<const_int,_BmsNote>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
             *)(local_38->lanes_ + lVar7));
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x14);
  FixIncorrectLongNote(this);
  return;
}

Assistant:

void BmsNoteManager::DP_TO_SP() {
	// just merge note at first
	for (int c = 10; c < 20; c++) {
		for (auto it = lanes_[c].Begin(); it != lanes_[c].End(); ++it) {
			lanes_[c - 10].Set(it->first, it->second);
		}
		lanes_[c].Clear();
	}

	// after merge, check LN validation.
	FixIncorrectLongNote();
}